

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  RepeatedField<int> *this_00;
  uint32 uVar1;
  Type TVar2;
  ulong uVar3;
  int iVar4;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar1 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    iVar4 = *(int *)(field + 0x38);
    TVar2 = FieldDescriptor::type(field);
    ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),iVar4,
               (FieldType)TVar2,*(bool *)(*(long *)(field + 0x80) + 0x6c),value,field);
    return;
  }
  uVar1 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar3 = (ulong)uVar1;
  this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
  iVar4 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
  if (iVar4 == *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3 + 4)) {
    RepeatedField<int>::Reserve(this_00,iVar4 + 1);
    iVar4 = this_00->current_size_;
  }
  this_00->current_size_ = iVar4 + 1;
  this_00->rep_->elements[iVar4] = value;
  return;
}

Assistant:

void GeneratedMessageReflection::AddEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(),
                                          value, field);
  } else {
    AddField<int>(message, field, value);
  }
}